

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

void __thiscall vm::VM::Tscan<unsigned_char>(VM *this)

{
  bool bVar1;
  istream *piVar2;
  IOError *this_00;
  char_t local_11;
  VM *pVStack_10;
  uchar value;
  VM *this_local;
  
  pVStack_10 = this;
  piVar2 = std::operator>>((istream *)&std::cin,&local_11);
  bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
  if (!bVar1) {
    this_00 = (IOError *)__cxa_allocate_exception(8);
    IOError::IOError(this_00);
    __cxa_throw(this_00,&IOError::typeinfo,IOError::~IOError);
  }
  PUSH<unsigned_char>(this,local_11);
  return;
}

Assistant:

void VM::Tscan() {
    if (T value; std::cin >> value) {
        PUSH(value);
    }
    else {
        throw IOError();
    }
}